

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlCharEncFirstLine(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  int local_38;
  uint local_34;
  int local_30;
  int toconv;
  int written;
  int ret;
  xmlBufferPtr in_local;
  xmlBufferPtr out_local;
  xmlCharEncodingHandler *handler_local;
  
  if (handler == (xmlCharEncodingHandler *)0x0) {
    handler_local._4_4_ = -1;
  }
  else if (out == (xmlBufferPtr)0x0) {
    handler_local._4_4_ = -1;
  }
  else if (in == (xmlBufferPtr)0x0) {
    handler_local._4_4_ = -1;
  }
  else {
    local_30 = (out->size - out->use) + -1;
    local_34 = in->use;
    if (0xb4 < (int)local_34) {
      local_34 = 0xb4;
    }
    _written = in;
    in_local = out;
    out_local = (xmlBufferPtr)handler;
    if (local_30 <= (int)(local_34 * 2)) {
      xmlBufferGrow(out,local_34 << 1);
      local_30 = (in_local->size - in_local->use) + -1;
    }
    toconv = xmlEncInputChunk((xmlCharEncodingHandler *)out_local,in_local->content + in_local->use,
                              &local_30,_written->content,(int *)&local_34,0);
    xmlBufferShrink(_written,local_34);
    in_local->use = local_30 + in_local->use;
    in_local->content[in_local->use] = '\0';
    if (toconv == -1) {
      toconv = -3;
    }
    if (toconv == -3) {
      toconv = 0;
    }
    if (toconv == -1) {
      toconv = 0;
    }
    if (local_30 == 0) {
      local_38 = toconv;
    }
    else {
      local_38 = local_30;
    }
    handler_local._4_4_ = local_38;
  }
  return handler_local._4_4_;
}

Assistant:

int
xmlCharEncFirstLine(xmlCharEncodingHandler *handler, xmlBufferPtr out,
                    xmlBufferPtr in) {
    int ret;
    int written;
    int toconv;

    if (handler == NULL) return(-1);
    if (out == NULL) return(-1);
    if (in == NULL) return(-1);

    /* calculate space available */
    written = out->size - out->use - 1; /* count '\0' */
    toconv = in->use;
    /*
     * echo '<?xml version="1.0" encoding="UCS4"?>' | wc -c => 38
     * 45 chars should be sufficient to reach the end of the encoding
     * declaration without going too far inside the document content.
     * on UTF-16 this means 90bytes, on UCS4 this means 180
     * The actual value depending on guessed encoding is passed as @len
     * if provided
     */
    if (toconv > 180)
        toconv = 180;
    if (toconv * 2 >= written) {
        xmlBufferGrow(out, toconv * 2);
	written = out->size - out->use - 1;
    }

    ret = xmlEncInputChunk(handler, &out->content[out->use], &written,
                           in->content, &toconv, 0);
    xmlBufferShrink(in, toconv);
    out->use += written;
    out->content[out->use] = 0;
    if (ret == -1) ret = -3;

#ifdef DEBUG_ENCODING
    switch (ret) {
        case 0:
	    xmlGenericError(xmlGenericErrorContext,
		    "converted %d bytes to %d bytes of input\n",
	            toconv, written);
	    break;
        case -1:
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of input, %d left\n",
	            toconv, written, in->use);
	    break;
        case -2:
	    xmlGenericError(xmlGenericErrorContext,
		    "input conversion failed due to input error\n");
	    break;
        case -3:
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of input, %d left\n",
	            toconv, written, in->use);
	    break;
	default:
	    xmlGenericError(xmlGenericErrorContext,"Unknown input conversion failed %d\n", ret);
    }
#endif /* DEBUG_ENCODING */
    /*
     * Ignore when input buffer is not on a boundary
     */
    if (ret == -3) ret = 0;
    if (ret == -1) ret = 0;
    return(written ? written : ret);
}